

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int untrap_prob(trap *ttmp)

{
  boolean bVar1;
  int iVar2;
  int local_14;
  int chance;
  trap *ttmp_local;
  
  local_14 = 3;
  if ((((ttmp->field_0x8 & 0x1f) == 0x13) && (youmonst.data != mons + 0x62)) &&
     (youmonst.data != mons + 100)) {
    local_14 = 0x1e;
  }
  if ((u.uprops[0x1c].intrinsic != 0) ||
     (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
      ((u.umonnum == u.umonster || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')))))) {
    local_14 = local_14 + 1;
  }
  if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
      (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
     ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) {
    local_14 = local_14 + 1;
  }
  if (((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c'))
  {
    local_14 = local_14 + 2;
  }
  if ((u.uprops[0x25].intrinsic != 0) || (u.uprops[0x25].extrinsic != 0)) {
    local_14 = local_14 << 1;
  }
  if ((char)ttmp->field_0x8 < '\0') {
    local_14 = local_14 + -1;
  }
  if (urole.malenum == 0x164) {
    iVar2 = rn2(0x3c);
    if (iVar2 < u.ulevel) {
      local_14 = local_14 + -1;
    }
    if ((((byte)u.uhave._0_1_ >> 4 & 1) != 0) && (1 < local_14)) {
      local_14 = local_14 + -1;
    }
  }
  else if ((urole.malenum == 0x163) && (1 < local_14)) {
    local_14 = local_14 + -1;
  }
  iVar2 = rn2(local_14);
  return iVar2;
}

Assistant:

static int untrap_prob(struct trap *ttmp)
{
	int chance = 3;

	/* Only spiders know how to deal with webs reliably */
	if (ttmp->ttyp == WEB && !webmaker(youmonst.data))
	 	chance = 30;
	if (Confusion || Hallucination) chance++;
	if (Blind) chance++;
	if (Stunned) chance += 2;
	if (Fumbling) chance *= 2;
	/* Your own traps are better known than others. */
	if (ttmp->madeby_u) chance--;
	if (Role_if (PM_ROGUE)) {
	    if (rn2(2 * MAXULEV) < u.ulevel) chance--;
	    if (u.uhave.questart && chance > 1) chance--;
	} else if (Role_if (PM_RANGER) && chance > 1) chance--;
	return rn2(chance);
}